

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dac(j_decompress_ptr cinfo)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long *in_RDI;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int val;
  int index;
  JLONG length;
  long local_38;
  byte *local_30;
  long local_18;
  
  puVar2 = (undefined8 *)in_RDI[5];
  local_30 = (byte *)*puVar2;
  local_38 = puVar2[1];
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  local_38 = local_38 + -1;
  bVar1 = *local_30;
  local_30 = local_30 + 1;
  if (local_38 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = (byte *)*puVar2;
    local_38 = puVar2[1];
  }
  local_18 = (ulong)*local_30 + (ulong)bVar1 * 0x100;
  do {
    local_18 = local_18 + -2;
    local_30 = local_30 + 1;
    local_38 = local_38 + -1;
    if (local_18 < 1) {
      if (local_18 != 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0xb;
        (**(code **)*in_RDI)(in_RDI);
      }
      *puVar2 = local_30;
      puVar2[1] = local_38;
      return 1;
    }
    if (local_38 == 0) {
      iVar3 = (*(code *)puVar2[3])(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      local_30 = (byte *)*puVar2;
      local_38 = puVar2[1];
    }
    local_38 = local_38 + -1;
    uVar4 = (uint)*local_30;
    local_30 = local_30 + 1;
    if (local_38 == 0) {
      iVar3 = (*(code *)puVar2[3])(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      local_30 = (byte *)*puVar2;
      local_38 = puVar2[1];
    }
    bVar1 = *local_30;
    uVar5 = (uint)bVar1;
    *(undefined4 *)(*in_RDI + 0x28) = 0x4f;
    *(uint *)(*in_RDI + 0x2c) = uVar4;
    *(uint *)(*in_RDI + 0x30) = uVar5;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    if (0x1f < uVar4) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      *(uint *)(*in_RDI + 0x2c) = uVar4;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (uVar4 < 0x10) {
      *(byte *)((long)in_RDI + (long)(int)uVar4 + 0x140) = bVar1 & 0xf;
      *(char *)((long)in_RDI + (long)(int)uVar4 + 0x150) = (char)((int)uVar5 >> 4);
      if (*(byte *)((long)in_RDI + (long)(int)uVar4 + 0x150) <
          *(byte *)((long)in_RDI + (long)(int)uVar4 + 0x140)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x1d;
        *(uint *)(*in_RDI + 0x2c) = uVar5;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else {
      *(byte *)((long)in_RDI + (long)(int)(uVar4 - 0x10) + 0x160) = bVar1;
    }
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dac(j_decompress_ptr cinfo)
/* Process a DAC marker */
{
  JLONG length;
  int index, val;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  while (length > 0) {
    INPUT_BYTE(cinfo, index, return FALSE);
    INPUT_BYTE(cinfo, val, return FALSE);

    length -= 2;

    TRACEMS2(cinfo, 1, JTRC_DAC, index, val);

    if (index < 0 || index >= (2 * NUM_ARITH_TBLS))
      ERREXIT1(cinfo, JERR_DAC_INDEX, index);

    if (index >= NUM_ARITH_TBLS) { /* define AC table */
      cinfo->arith_ac_K[index - NUM_ARITH_TBLS] = (UINT8)val;
    } else {                    /* define DC table */
      cinfo->arith_dc_L[index] = (UINT8)(val & 0x0F);
      cinfo->arith_dc_U[index] = (UINT8)(val >> 4);
      if (cinfo->arith_dc_L[index] > cinfo->arith_dc_U[index])
        ERREXIT1(cinfo, JERR_DAC_VALUE, val);
    }
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}